

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O0

void __thiscall
duckdb::DependencyManager::AlterObject
          (DependencyManager *this,CatalogTransaction transaction,CatalogEntry *old_obj,
          CatalogEntry *new_obj,AlterInfo *alter_info)

{
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  CatalogTransaction transaction_02;
  bool bVar1;
  CatalogEntry *in_RDX;
  DependencyManager *in_RDI;
  vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_> *in_stack_00000008;
  CatalogEntryInfo *in_stack_00000010;
  anon_class_32_4_c2c4161f *in_stack_00000018;
  string *in_stack_00000020;
  undefined8 in_stack_00000028;
  DependencyInfo *dep;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::DependencyInfo,_true> *__range1;
  DependencyManager *in_stack_000000a0;
  CatalogTransaction in_stack_000000b0;
  dependency_set_t dependents;
  vector<duckdb::DependencyInfo,_true> dependencies;
  CatalogEntryInfo new_info;
  CatalogEntryInfo old_info;
  vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_> *this_00;
  CatalogEntryInfo *this_01;
  anon_class_32_4_4ffd5e67 *in_stack_fffffffffffffd58;
  anon_class_32_4_c2c4161f *__f;
  function<void_(duckdb::DependencyEntry_&)> *in_stack_fffffffffffffd60;
  string *this_02;
  dependency_callback_t *in_stack_fffffffffffffda0;
  CatalogEntry *in_stack_fffffffffffffda8;
  DependencyManager *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  __normal_iterator<duckdb::DependencyInfo_*,_std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>_>
  in_stack_fffffffffffffdd8;
  transaction_t in_stack_fffffffffffffde0;
  CatalogEntry *in_stack_fffffffffffffee8;
  DependencyManager *in_stack_fffffffffffffef0;
  CatalogEntryInfo *pCVar2;
  anon_class_32_4_c2c4161f *paVar3;
  string *psVar4;
  transaction_t in_stack_ffffffffffffff20;
  
  bVar1 = IsSystemEntry(in_RDI,in_RDX);
  if (!bVar1) {
    GetLookupProperties(in_stack_fffffffffffffda8);
    GetLookupProperties(in_stack_fffffffffffffda8);
    vector<duckdb::DependencyInfo,_true>::vector((vector<duckdb::DependencyInfo,_true> *)0x2a967d7);
    pCVar2 = in_stack_00000010;
    __f = in_stack_00000018;
    this_02 = in_stack_00000020;
    ::std::function<void_(duckdb::DependencyEntry_&)>::
    function<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_catalog_dependency_manager_cpp:630:40),_void>
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    transaction_00.context.ptr = (ClientContext *)in_stack_fffffffffffffdc8;
    transaction_00.db.ptr = (DatabaseInstance *)in_stack_fffffffffffffdc0;
    transaction_00.transaction.ptr = (Transaction *)in_stack_fffffffffffffdd0;
    transaction_00.transaction_id = (transaction_t)in_stack_fffffffffffffdd8._M_current;
    transaction_00.start_time = in_stack_fffffffffffffde0;
    paVar3 = __f;
    psVar4 = this_02;
    ScanDependents(in_stack_fffffffffffffdb0,transaction_00,
                   (CatalogEntryInfo *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    ::std::function<void_(duckdb::DependencyEntry_&)>::~function
              ((function<void_(duckdb::DependencyEntry_&)> *)0x2a968a2);
    ::std::
    unordered_set<duckdb::Dependency,_duckdb::DependencyHashFunction,_duckdb::DependencyEquality,_std::allocator<duckdb::Dependency>_>
    ::unordered_set((unordered_set<duckdb::Dependency,_duckdb::DependencyHashFunction,_duckdb::DependencyEquality,_std::allocator<duckdb::Dependency>_>
                     *)0x2a968af);
    ::std::function<void_(duckdb::DependencyEntry_&)>::
    function<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_catalog_dependency_manager_cpp:675:38),_void>
              ((function<void_(duckdb::DependencyEntry_&)> *)this_02,__f);
    transaction_01.context.ptr = (ClientContext *)in_stack_fffffffffffffdc8;
    transaction_01.db.ptr = (DatabaseInstance *)in_stack_fffffffffffffdc0;
    transaction_01.transaction.ptr = (Transaction *)in_stack_fffffffffffffdd0;
    transaction_01.transaction_id = (transaction_t)in_stack_fffffffffffffdd8._M_current;
    transaction_01.start_time = in_stack_fffffffffffffde0;
    this_00 = in_stack_00000008;
    this_01 = in_stack_00000010;
    ScanSubjects(in_stack_fffffffffffffdb0,transaction_01,
                 (CatalogEntryInfo *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    ::std::function<void_(duckdb::DependencyEntry_&)>::~function
              ((function<void_(duckdb::DependencyEntry_&)> *)0x2a96972);
    bVar1 = StringUtil::CIEquals(in_stack_00000020,(string *)in_stack_00000018);
    if (!bVar1) {
      transaction_02.context.ptr = (ClientContext *)paVar3;
      transaction_02.db.ptr = (DatabaseInstance *)pCVar2;
      transaction_02.transaction.ptr = (Transaction *)psVar4;
      transaction_02.transaction_id = in_stack_00000028;
      transaction_02.start_time = in_stack_ffffffffffffff20;
      this_00 = in_stack_00000008;
      this_01 = in_stack_00000010;
      CleanupDependencies(in_stack_fffffffffffffef0,transaction_02,in_stack_fffffffffffffee8);
    }
    ::std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>::begin(this_00);
    ::std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>::end(this_00);
    while (bVar1 = __gnu_cxx::
                   operator!=<duckdb::DependencyInfo_*,_std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>_>
                             ((__normal_iterator<duckdb::DependencyInfo_*,_std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>_>
                               *)this_01,
                              (__normal_iterator<duckdb::DependencyInfo_*,_std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>_>
                               *)this_00), bVar1) {
      __gnu_cxx::
      __normal_iterator<duckdb::DependencyInfo_*,_std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>_>
      ::operator*((__normal_iterator<duckdb::DependencyInfo_*,_std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>_>
                   *)&stack0xfffffffffffffdd8);
      this_00 = in_stack_00000008;
      this_01 = in_stack_00000010;
      CreateDependency(in_stack_000000a0,in_stack_000000b0,(DependencyInfo *)__range1);
      __gnu_cxx::
      __normal_iterator<duckdb::DependencyInfo_*,_std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>_>
      ::operator++((__normal_iterator<duckdb::DependencyInfo_*,_std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>_>
                    *)&stack0xfffffffffffffdd8);
    }
    ::std::
    unordered_set<duckdb::Dependency,_duckdb::DependencyHashFunction,_duckdb::DependencyEquality,_std::allocator<duckdb::Dependency>_>
    ::~unordered_set((unordered_set<duckdb::Dependency,_duckdb::DependencyHashFunction,_duckdb::DependencyEquality,_std::allocator<duckdb::Dependency>_>
                      *)0x2a96b7f);
    vector<duckdb::DependencyInfo,_true>::~vector((vector<duckdb::DependencyInfo,_true> *)0x2a96b8c)
    ;
    CatalogEntryInfo::~CatalogEntryInfo(this_01);
    CatalogEntryInfo::~CatalogEntryInfo(this_01);
  }
  return;
}

Assistant:

void DependencyManager::AlterObject(CatalogTransaction transaction, CatalogEntry &old_obj, CatalogEntry &new_obj,
                                    AlterInfo &alter_info) {
	if (IsSystemEntry(new_obj)) {
		D_ASSERT(IsSystemEntry(old_obj));
		// Don't do anything for this
		return;
	}

	const auto old_info = GetLookupProperties(old_obj);
	const auto new_info = GetLookupProperties(new_obj);

	vector<DependencyInfo> dependencies;
	// Other entries that depend on us
	ScanDependents(transaction, old_info, [&](DependencyEntry &dep) {
		// It makes no sense to have a schema depend on anything
		D_ASSERT(dep.EntryInfo().type != CatalogType::SCHEMA_ENTRY);

		bool disallow_alter = true;
		switch (alter_info.type) {
		case AlterType::ALTER_TABLE: {
			auto &alter_table = alter_info.Cast<AlterTableInfo>();
			switch (alter_table.alter_table_type) {
			case AlterTableType::FOREIGN_KEY_CONSTRAINT: {
				// These alters are made as part of a CREATE or DROP table statement when a foreign key column is
				// present either adding or removing a reference to the referenced primary key table
				disallow_alter = false;
				break;
			}
			case AlterTableType::ADD_COLUMN: {
				disallow_alter = false;
				break;
			}
			default:
				break;
			}
			break;
		}
		case AlterType::SET_COLUMN_COMMENT:
		case AlterType::SET_COMMENT: {
			disallow_alter = false;
			break;
		}
		default:
			break;
		}
		if (disallow_alter) {
			throw DependencyException("Cannot alter entry \"%s\" because there are entries that "
			                          "depend on it.",
			                          old_obj.name);
		}

		auto dep_info = DependencyInfo::FromDependent(dep);
		dep_info.subject.entry = new_info;
		dependencies.emplace_back(dep_info);
	});

	// Keep old dependencies
	dependency_set_t dependents;
	ScanSubjects(transaction, old_info, [&](DependencyEntry &dep) {
		auto entry = LookupEntry(transaction, dep);
		if (!entry) {
			return;
		}

		auto dep_info = DependencyInfo::FromSubject(dep);
		dep_info.dependent.entry = new_info;
		dependencies.emplace_back(dep_info);
	});

	// FIXME: we should update dependencies in the future
	// some alters could cause dependencies to change (imagine types of table columns)
	// or DEFAULT depending on a sequence
	if (!StringUtil::CIEquals(old_obj.name, new_obj.name)) {
		// The name has been changed, we need to recreate the dependency links
		CleanupDependencies(transaction, old_obj);
	}

	// Reinstate the old dependencies
	for (auto &dep : dependencies) {
		CreateDependency(transaction, dep);
	}
}